

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

TermList __thiscall
Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::denormalize
          (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *this,TermList *results)

{
  TermList t;
  TermList t_00;
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  long in_RSI;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_RDI;
  uint i;
  uint end;
  anon_class_1_0_00000001 prependPowerTerm;
  TermList out;
  undefined8 in_stack_ffffffffffffffb0;
  int pow;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb8;
  anon_class_1_0_00000001 *this_00;
  TermList in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar4;
  uint uVar5;
  uint64_t local_8;
  
  pow = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  sVar3 = Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size
                    (in_RDI);
  if (sVar3 == 0) {
    local_8 = (uint64_t)NumTraits<Kernel::RealConstantType>::one();
  }
  else {
    uVar1 = nFactors((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x91604c);
    uVar1 = uVar1 - 1;
    Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
              (in_RDI,(ulong)uVar1);
    t._content._4_4_ = in_stack_ffffffffffffffcc;
    t._content._0_4_ = in_stack_ffffffffffffffc8;
    local_8 = (uint64_t)
              denormalize::anon_class_1_0_00000001::operator()
                        (in_stack_ffffffffffffffb8,t,pow,in_stack_ffffffffffffffc0);
    uVar4 = 1;
    while (uVar5 = uVar4,
          uVar2 = nFactors((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x9160c0),
          uVar4 < uVar2) {
      this_00 = *(anon_class_1_0_00000001 **)(in_RSI + (ulong)(uVar1 - uVar5) * 8);
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
                (in_RDI,(ulong)(uVar1 - uVar5));
      t_00._content._4_4_ = uVar5;
      t_00._content._0_4_ = in_stack_ffffffffffffffc8;
      in_stack_ffffffffffffffc0 =
           denormalize::anon_class_1_0_00000001::operator()
                     (this_00,t_00,(int)(local_8 >> 0x20),in_stack_ffffffffffffffc0);
      local_8 = in_stack_ffffffffffffffc0._content;
      uVar4 = uVar5 + 1;
    }
  }
  return (TermList)local_8;
}

Assistant:

TermList MonomFactors<Number>::denormalize(TermList* results)  const
{
  if (_factors.size() == 0) {
    return Number::one();
  } else {

    auto prependPowerTerm = [](TermList t, int pow, TermList tail) -> TermList {
      TermList out = tail;
      for (int i = 0; i < pow; i++) {
        out = Number::mul(t,out);
      }
      return out;
    };

    auto end = nFactors() - 1;
    ASS(_factors[end].power > 0)
    TermList out = prependPowerTerm(results[end], _factors[end].power - 1, results[end]);

    for (unsigned i = 1; i < nFactors(); i++) {
      out = prependPowerTerm(results[end - i], _factors[end - i].power, out);
    }

    return out;
  }
}